

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void CopyRow_SSE2(uint8_t *src,uint8_t *dst,int width)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  
  if ((((ulong)src & 0xf) == 0) && (((ulong)dst & 0xf) == 0)) {
    do {
      uVar2 = *(undefined8 *)src;
      uVar3 = *(undefined8 *)(src + 8);
      uVar4 = *(undefined8 *)(src + 0x10);
      uVar5 = *(undefined8 *)(src + 0x18);
      src = src + 0x20;
      *(undefined8 *)dst = uVar2;
      *(undefined8 *)(dst + 8) = uVar3;
      *(undefined8 *)(dst + 0x10) = uVar4;
      *(undefined8 *)(dst + 0x18) = uVar5;
      dst = dst + 0x20;
      iVar6 = width + -0x20;
      bVar1 = 0x1f < width;
      width = iVar6;
    } while (iVar6 != 0 && bVar1);
  }
  else {
    do {
      uVar2 = *(undefined8 *)src;
      uVar3 = *(undefined8 *)(src + 8);
      uVar4 = *(undefined8 *)(src + 0x10);
      uVar5 = *(undefined8 *)(src + 0x18);
      src = src + 0x20;
      *(undefined8 *)dst = uVar2;
      *(undefined8 *)(dst + 8) = uVar3;
      *(undefined8 *)(dst + 0x10) = uVar4;
      *(undefined8 *)(dst + 0x18) = uVar5;
      dst = dst + 0x20;
      iVar6 = width + -0x20;
      bVar1 = 0x1f < width;
      width = iVar6;
    } while (iVar6 != 0 && bVar1);
  }
  return;
}

Assistant:

void CopyRow_SSE2(const uint8_t* src, uint8_t* dst, int width) {
  asm volatile(
      "test        $0xf,%0                       \n"
      "jne         2f                            \n"
      "test        $0xf,%1                       \n"
      "jne         2f                            \n"

      LABELALIGN
      "1:                                        \n"
      "movdqa      (%0),%%xmm0                   \n"
      "movdqa      0x10(%0),%%xmm1               \n"
      "lea         0x20(%0),%0                   \n"
      "movdqa      %%xmm0,(%1)                   \n"
      "movdqa      %%xmm1,0x10(%1)               \n"
      "lea         0x20(%1),%1                   \n"
      "sub         $0x20,%2                      \n"
      "jg          1b                            \n"
      "jmp         9f                            \n"

      LABELALIGN
      "2:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "lea         0x20(%0),%0                   \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "movdqu      %%xmm1,0x10(%1)               \n"
      "lea         0x20(%1),%1                   \n"
      "sub         $0x20,%2                      \n"
      "jg          2b                            \n"

      LABELALIGN "9:                                        \n"
      : "+r"(src),   // %0
        "+r"(dst),   // %1
        "+r"(width)  // %2
      :
      : "memory", "cc", "xmm0", "xmm1");
}